

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::GetAnimationFileList
          (SMDImporter *this,string *pFile,IOSystem *pIOHandler,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outList)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar2;
  string animName;
  vector<char,_std::allocator<char>_> buf;
  char *context1;
  string animPath;
  string base;
  char *context2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string name;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *stream;
  
  DefaultIOSystem::absolutePath(&base,pFile);
  DefaultIOSystem::completeBaseName(&name,pFile);
  std::operator+(&animName,&base,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                 &animName,&name);
  std::operator+(&path,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b0,"_animation.txt");
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&animName);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,path._M_dataplus._M_p,"rb");
  stream = (IOStream *)CONCAT44(extraout_var,iVar1);
  if (stream != (IOStream *)0x0) {
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar1 = (*stream->_vptr_IOStream[6])(stream);
    std::vector<char,_std::allocator<char>_>::resize(&buf,CONCAT44(extraout_var_00,iVar1) + 1);
    BaseImporter::TextFileToBuffer(stream,&buf,FORBID_EMPTY);
    animName._M_dataplus._M_p = (pointer)&animName.field_2;
    animName._M_string_length = 0;
    animPath._M_dataplus._M_p = (pointer)&animPath.field_2;
    animPath._M_string_length = 0;
    animName.field_2._M_local_buf[0] = '\0';
    animPath.field_2._M_local_buf[0] = '\0';
    pcVar2 = strtok_r(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,"\r\n",&context1);
    while (pcVar2 != (char *)0x0) {
      pcVar2 = strtok_r(pcVar2," \t",&context2);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = strtok_r((char *)0x0," \t",&context2);
        if (pcVar2 == (char *)0x0) {
          std::__cxx11::string::assign((char *)&animPath);
          DefaultIOSystem::completeBaseName((string *)&local_b0,&animPath);
          std::__cxx11::string::operator=((string *)&animName,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          std::__cxx11::string::assign((char *)&animPath);
          std::__cxx11::string::assign((char *)&animName);
        }
        std::operator+(&local_70,&base,"/");
        std::operator+(&local_50,&local_70,&animPath);
        std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string>::
        _Tuple_impl<std::__cxx11::string&,std::__cxx11::string,void>
                  ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string> *)&local_b0,&animName
                   ,&local_50);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<std::tuple<std::__cxx11::string,std::__cxx11::string>>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string>>>
                    *)outList,
                   (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_b0);
        std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Tuple_impl(&local_b0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      pcVar2 = strtok_r((char *)0x0,"\r\n",&context1);
    }
    std::__cxx11::string::~string((string *)&animPath);
    std::__cxx11::string::~string((string *)&animName);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buf.super__Vector_base<char,_std::allocator<char>_>);
    (*stream->_vptr_IOStream[1])();
  }
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&base);
  return;
}

Assistant:

void SMDImporter::GetAnimationFileList(const std::string &pFile, IOSystem* pIOHandler, std::vector<std::tuple<std::string, std::string>>& outList) {
    auto base = DefaultIOSystem::absolutePath(pFile);
    auto name = DefaultIOSystem::completeBaseName(pFile);
    auto path = base + "/" + name + "_animation.txt";

    std::unique_ptr<IOStream> file(pIOHandler->Open(path.c_str(), "rb"));
    if (file.get() == nullptr) {
        return;
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> buf;
    size_t fileSize = file->FileSize();
    buf.resize(fileSize + 1);
    TextFileToBuffer(file.get(), buf);

    /*
        *_animation.txt format:
        name path
        idle idle.smd
        jump anim/jump.smd
        walk.smd
        ...
    */
    std::string animName, animPath;
    char *tok1, *tok2;
    char *context1, *context2;

    tok1 = strtok_s(&buf[0], "\r\n", &context1);
    while (tok1 != NULL) {
        tok2 = strtok_s(tok1, " \t", &context2);
        if (tok2) {
            char *p = tok2;
            tok2 = strtok_s(nullptr, " \t", &context2);
            if (tok2) {
                animPath = tok2;
                animName = p;
            } else  {
                // No name
                animPath = p;
                animName = DefaultIOSystem::completeBaseName(animPath);
            }
            outList.push_back(std::make_tuple(animName, base + "/" + animPath));
        }
        tok1 = strtok_s(nullptr, "\r\n", &context1);
    }
}